

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall Tree::BuildVirtualFolder(Tree *this,string *virtualFolders)

{
  const_iterator virtualFolders_00;
  bool bVar1;
  pointer this_00;
  allocator local_49;
  string local_48;
  __normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> local_28;
  __normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> local_20;
  const_iterator it;
  string *virtualFolders_local;
  Tree *this_local;
  
  it._M_current = (Tree *)virtualFolders;
  std::__cxx11::string::operator+=
            ((string *)virtualFolders,"<Option virtualFolders=\"CMake Files\\;");
  local_20._M_current = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::begin(&this->folders);
  while( true ) {
    local_28._M_current = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::end(&this->folders);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
              ::operator->(&local_20);
    virtualFolders_00 = it;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"",&local_49);
    BuildVirtualFolderImpl(this_00,&(virtualFolders_00._M_current)->path,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::
    operator++(&local_20);
  }
  std::__cxx11::string::operator+=((string *)it._M_current,"\" />");
  return;
}

Assistant:

void Tree::BuildVirtualFolder(std::string& virtualFolders) const
{
  virtualFolders += "<Option virtualFolders=\"CMake Files\\;";
  for (std::vector<Tree>::const_iterator it = folders.begin();
     it != folders.end();
     ++it)
    {
    it->BuildVirtualFolderImpl(virtualFolders, "");
    }
  virtualFolders += "\" />";
}